

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bag.cpp
# Opt level: O0

void __thiscall minibag::Bag::decompressLz4Chunk(Bag *this,ChunkHeader *chunk_header)

{
  uint32_t source_len;
  element_type *peVar1;
  uint8_t *source;
  uint8_t *in_RSI;
  long in_RDI;
  ChunkedFile *unaff_retaddr;
  CompressionType compression;
  Buffer *in_stack_ffffffffffffffc0;
  uint dest_len;
  long lVar2;
  CompressionType compression_00;
  
  dest_len = 2;
  lVar2 = in_RDI;
  miniros_console_bridge::log
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/rosbag_storage/bag.cpp"
             ,0x3a4,CONSOLE_BRIDGE_LOG_DEBUG,"lz4 compressed_size: %d uncompressed_size: %d",
             (ulong)*(uint *)(in_RSI + 0x20),(ulong)*(uint *)(in_RSI + 0x24));
  compression_00 = (CompressionType)((ulong)lVar2 >> 0x20);
  peVar1 = std::
           __shared_ptr_access<minibag::EncryptorBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<minibag::EncryptorBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x165cad);
  (*peVar1->_vptr_EncryptorBase[4])(peVar1,in_RSI,in_RDI + 0x230,in_RDI + 8);
  Buffer::setSize(in_stack_ffffffffffffffc0,(uint32_t)((ulong)in_RDI >> 0x20));
  Buffer::getData((Buffer *)(in_RDI + 0x240));
  source_len = Buffer::getSize((Buffer *)(in_RDI + 0x240));
  source = Buffer::getData((Buffer *)(in_RDI + 0x230));
  Buffer::getSize((Buffer *)(in_RDI + 0x230));
  ChunkedFile::decompress(unaff_retaddr,compression_00,in_RSI,dest_len,source,source_len);
  return;
}

Assistant:

void Bag::decompressLz4Chunk(ChunkHeader const& chunk_header) const {
    assert(chunk_header.compression == COMPRESSION_LZ4);

    CompressionType compression = compression::LZ4;

    MINIROS_CONSOLE_BRIDGE_logDebug("lz4 compressed_size: %d uncompressed_size: %d",
             chunk_header.compressed_size, chunk_header.uncompressed_size);

    encryptor_->decryptChunk(chunk_header, chunk_buffer_, file_);

    decompress_buffer_.setSize(chunk_header.uncompressed_size);
    file_.decompress(compression, decompress_buffer_.getData(), decompress_buffer_.getSize(), chunk_buffer_.getData(), chunk_buffer_.getSize());

    // todo check read was successful
}